

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderSAH<8,_embree::QuadMi<4>_>::build
          (BVHNBuilderSAH<8,_embree::QuadMi<4>_> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  BVH *pBVar5;
  pointer ppTVar6;
  Device *pDVar7;
  Block *pBVar8;
  PrimRef *pPVar9;
  MemoryMonitorInterface *pMVar10;
  Geometry *pGVar11;
  Scene *pSVar12;
  GTypeMask GVar13;
  BVHN<8> *this_00;
  double dVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  long lVar19;
  long *plVar20;
  PrimRef *pPVar21;
  NodeRef root;
  ulong uVar22;
  uint uVar23;
  long *plVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong uVar26;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *prims;
  __pointer_type pBVar27;
  pointer ppTVar28;
  ulong uVar29;
  size_t sVar30;
  double t0;
  PrimInfo pinfo;
  string __str;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  long local_a8;
  long local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  if ((this->mesh != (Geometry *)0x0) && (this->mesh->numPrimitives != this->numPreviousPrimitives))
  {
    pBVar5 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar5->alloc);
    ppTVar6 = (pBVar5->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar28 = (pBVar5->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar28 != ppTVar6;
        ppTVar28 = ppTVar28 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar28,&pBVar5->alloc);
    }
    ppTVar28 = (pBVar5->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar5->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar28) {
      (pBVar5->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar28;
    }
    LOCK();
    (pBVar5->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar5->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar5->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar5->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar7 = (pBVar5->alloc).device;
      bVar4 = (pBVar5->alloc).useUSM;
      pBVar27 = (pBVar5->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar8 = pBVar27->next;
        FastAllocator::Block::clear_block(pBVar27,pDVar7,bVar4);
        pBVar27 = pBVar8;
      } while (pBVar8 != (Block *)0x0);
    }
    LOCK();
    (pBVar5->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar5->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar7 = (pBVar5->alloc).device;
      bVar4 = (pBVar5->alloc).useUSM;
      pBVar27 = (pBVar5->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar8 = pBVar27->next;
        FastAllocator::Block::clear_block(pBVar27,pDVar7,bVar4);
        pBVar27 = pBVar8;
      } while (pBVar8 != (Block *)0x0);
    }
    LOCK();
    (pBVar5->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar19 = -8;
    do {
      LOCK();
      (pBVar5->alloc).threadBlocks[lVar19]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar5->alloc).threadBlocks[lVar19 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0);
    sVar30 = (pBVar5->alloc).primrefarray.size_alloced;
    pPVar9 = (pBVar5->alloc).primrefarray.items;
    if (pPVar9 != (PrimRef *)0x0) {
      if (sVar30 << 5 < 0x1c00000) {
        alignedFree(pPVar9);
      }
      else {
        os_free(pPVar9,sVar30 << 5,(pBVar5->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar30 != 0) {
      pMVar10 = (pBVar5->alloc).primrefarray.alloc.device;
      (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar30 * -0x20,1);
    }
    (pBVar5->alloc).primrefarray.size_active = 0;
    (pBVar5->alloc).primrefarray.size_alloced = 0;
    (pBVar5->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar11 = this->mesh;
  if (pGVar11 == (Geometry *)0x0) {
    pSVar12 = this->scene;
    GVar13 = this->gtype_;
    uVar23 = (uint)GVar13;
    if ((uVar23 >> 0x14 & 1) == 0) {
      uVar22 = 0;
    }
    else {
      uVar22 = (pSVar12->world).numTriangles;
    }
    if ((uVar23 >> 0x15 & 1) != 0) {
      uVar22 = uVar22 + (pSVar12->world).numQuads;
    }
    if ((GVar13 & MTY_CURVE2) != ~MTY_ALL) {
      uVar22 = uVar22 + (pSVar12->world).numLineSegments;
    }
    if ((GVar13 & MTY_CURVE4) != ~MTY_ALL) {
      uVar22 = uVar22 + (pSVar12->world).numBezierCurves;
    }
    if ((GVar13 & MTY_POINTS) != ~MTY_ALL) {
      uVar22 = uVar22 + (pSVar12->world).numPoints;
    }
    if ((uVar23 >> 0x17 & 1) != 0) {
      uVar22 = uVar22 + (pSVar12->world).numSubdivPatches;
    }
    if ((uVar23 >> 0x1d & 1) != 0) {
      uVar22 = uVar22 + (pSVar12->world).numUserGeometries;
    }
    if ((uVar23 >> 0x1e & 1) != 0) {
      uVar22 = uVar22 + (pSVar12->world).numInstancesCheap;
    }
    if ((int)uVar23 < 0) {
      uVar22 = uVar22 + (pSVar12->world).numInstancesExpensive;
    }
    if ((uVar23 >> 0x18 & 1) != 0) {
      uVar22 = uVar22 + (pSVar12->world).numInstanceArrays;
    }
    if ((uVar23 >> 0x16 & 1) != 0) {
      uVar22 = uVar22 + (pSVar12->world).numGrids;
    }
  }
  else {
    uVar22 = (ulong)pGVar11->numPrimitives;
  }
  this->numPreviousPrimitives = (uint)uVar22;
  this_00 = this->bvh;
  if (uVar22 == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    sVar30 = (this->prims).size_alloced;
    pPVar9 = (this->prims).items;
    if (pPVar9 != (PrimRef *)0x0) {
      if (sVar30 << 5 < 0x1c00000) {
        alignedFree(pPVar9);
      }
      else {
        os_free(pPVar9,sVar30 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar30 != 0) {
      pMVar10 = (this->prims).alloc.device;
      (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar30 * -0x20,1);
    }
    (this->prims).size_active = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  else {
    if (pGVar11 == (Geometry *)0x0) {
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct((ulong)local_98,'\x01');
      *local_98[0] = 0x38;
      plVar20 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x2021eed);
      local_108 = &local_f8;
      plVar24 = plVar20 + 2;
      if ((long *)*plVar20 == plVar24) {
        local_f8 = *plVar24;
        lStack_f0 = plVar20[3];
      }
      else {
        local_f8 = *plVar24;
        local_108 = (long *)*plVar20;
      }
      local_100 = plVar20[1];
      *plVar20 = (long)plVar24;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      plVar20 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_e8._0_8_ = local_d8;
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 == paVar25) {
        local_d8[0]._0_8_ = paVar25->_M_allocated_capacity;
        local_d8[0]._8_8_ = plVar20[3];
      }
      else {
        local_d8[0]._0_8_ = paVar25->_M_allocated_capacity;
        local_e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar20;
      }
      local_e8._8_8_ = plVar20[1];
      *plVar20 = (long)paVar25;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
    }
    else {
      local_e8._0_8_ = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    }
    t0 = BVHN<8>::preBuild(this_00,(string *)&local_e8.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != local_d8) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (pGVar11 == (Geometry *)0x0) {
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
    if (this->primrefarrayalloc == true) {
      uVar26 = 0xffffffffffffffff;
      if (999999 < uVar22) {
        uVar26 = uVar22 / 1000;
      }
      (this->settings).primrefarrayalloc = uVar26;
    }
    if (this->mesh != (Geometry *)0x0) {
      (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
    }
    dVar14 = (double)(uVar22 + 3 >> 2) * 1.2 * 96.0;
    uVar26 = (ulong)dVar14;
    sVar30 = ((long)(dVar14 - 9.223372036854776e+18) & (long)uVar26 >> 0x3f | uVar26) +
             (uVar22 * 0x1c0 >> 5);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar30);
    sVar30 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,8,0x400,uVar22,sVar30);
    (this->settings).singleThreadThreshold = sVar30;
    uVar26 = (this->prims).size_alloced;
    uVar29 = uVar26;
    if ((uVar26 < uVar22) && (uVar29 = uVar22, uVar26 != 0)) {
      while (uVar29 = uVar26, uVar29 < uVar22) {
        uVar26 = uVar29 * 2 + (ulong)(uVar29 * 2 == 0);
      }
    }
    psVar1 = &(this->prims).size_active;
    if (uVar22 < (this->prims).size_active) {
      *psVar1 = uVar22;
    }
    prims = (EVP_PKEY_CTX *)&this->prims;
    if ((this->prims).size_alloced == uVar29) {
      *psVar1 = uVar22;
    }
    else {
      pPVar9 = (this->prims).items;
      if (uVar29 != 0) {
        pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar29 << 5,0);
      }
      sVar30 = uVar29 << 5;
      if (sVar30 < 0x1c00000) {
        pPVar21 = (PrimRef *)alignedMalloc(sVar30,0x20);
      }
      else {
        pPVar21 = (PrimRef *)os_malloc(sVar30,&(this->prims).alloc.hugepages);
      }
      (this->prims).items = pPVar21;
      if ((this->prims).size_active != 0) {
        lVar19 = 0;
        uVar26 = 0;
        do {
          puVar2 = (undefined8 *)((long)&(pPVar9->lower).field_0 + lVar19);
          uVar16 = puVar2[1];
          uVar17 = puVar2[2];
          uVar18 = puVar2[3];
          puVar3 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar19);
          *puVar3 = *puVar2;
          puVar3[1] = uVar16;
          puVar3[2] = uVar17;
          puVar3[3] = uVar18;
          uVar26 = uVar26 + 1;
          lVar19 = lVar19 + 0x20;
        } while (uVar26 < (this->prims).size_active);
      }
      sVar30 = (this->prims).size_alloced;
      if (pPVar9 != (PrimRef *)0x0) {
        if (sVar30 << 5 < 0x1c00000) {
          alignedFree(pPVar9);
        }
        else {
          os_free(pPVar9,sVar30 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar30 != 0) {
        pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar30 * -0x20,1);
      }
      (this->prims).size_active = uVar22;
      (this->prims).size_alloced = uVar29;
    }
    if (this->mesh == (Geometry *)0x0) {
      avx::createPrimRefArray
                ((PrimInfo *)&local_e8.field_1,this->scene,this->gtype_,false,uVar22,
                 (mvector<PrimRef> *)prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    else {
      avx::createPrimRefArray
                ((PrimInfo *)&local_e8.field_1,this->mesh,this->geomID_,uVar22,
                 (mvector<PrimRef> *)prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    local_78._8_8_ = this->bvh;
    if (local_a0 == local_a8) {
      (*(((BVH *)local_78._8_8_)->super_AccelData).super_RefCount._vptr_RefCount[5])();
      sVar30 = (this->prims).size_alloced;
      pPVar9 = (this->prims).items;
      if (pPVar9 != (PrimRef *)0x0) {
        if (sVar30 << 5 < 0x1c00000) {
          alignedFree(pPVar9);
        }
        else {
          os_free(pPVar9,sVar30 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar30 != 0) {
        pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar30 * -0x20,1);
      }
      *psVar1 = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
    }
    else {
      local_78._0_8_ = &PTR_createLeaf_02213508;
      root = BVHNBuilderVirtual<8>::BVHNBuilderV::build
                       ((BVHNBuilderV *)&local_78,&((BVH *)local_78._8_8_)->alloc,
                        &(((BVH *)local_78._8_8_)->scene->progressInterface).
                         super_BuildProgressMonitor,(this->prims).items,
                        (PrimInfo *)&local_e8.field_1,this->settings);
      local_78._0_8_ = local_e8._0_8_;
      local_78._8_8_ = local_e8._8_8_;
      local_68._0_8_ = local_d8[0]._M_allocated_capacity;
      local_68._8_8_ = local_d8[0]._8_8_;
      local_58._0_8_ = local_e8._0_8_;
      local_58._8_8_ = local_e8._8_8_;
      local_48._0_8_ = local_d8[0]._M_allocated_capacity;
      local_48._8_8_ = local_d8[0]._8_8_;
      BVHN<8>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78,local_a0 - local_a8);
      fVar15 = (float)(ulong)(local_a0 - local_a8) * 0.005;
      uVar22 = (ulong)fVar15;
      ctx = (EVP_PKEY_CTX *)((long)(fVar15 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
      BVHN<8>::layoutLargeNodes(this->bvh,(size_t)ctx);
      if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
        if ((this->scene != (Scene *)0x0) &&
           ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
          sVar30 = (this->prims).size_alloced;
          pPVar9 = (this->prims).items;
          if (pPVar9 != (PrimRef *)0x0) {
            ctx = (EVP_PKEY_CTX *)(sVar30 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pPVar9);
            }
            else {
              os_free(pPVar9,(size_t)ctx,(this->prims).alloc.hugepages);
            }
          }
          if (sVar30 != 0) {
            pMVar10 = (((mvector<PrimRef> *)prims)->alloc).device;
            ctx = (EVP_PKEY_CTX *)(sVar30 * -0x20);
            (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,ctx,1);
          }
          *psVar1 = 0;
          (this->prims).size_alloced = 0;
          (this->prims).items = (PrimRef *)0x0;
        }
      }
      else {
        FastAllocator::share(&this->bvh->alloc,(mvector<PrimRef> *)prims);
        ctx = prims;
      }
      BVHN<8>::cleanup(this->bvh,ctx);
      BVHN<8>::postBuild(this->bvh,t0);
    }
  }
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            /* create primref array */
            if (primrefarrayalloc) {
              settings.primrefarrayalloc = numPrimitives/1000;
              if (settings.primrefarrayalloc < 1000)
                settings.primrefarrayalloc = inf;
            }

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* initialize allocator */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            prims.resize(numPrimitives);

            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
              createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* pinfo might has zero size due to invalid geometry */
            if (unlikely(pinfo.size() == 0))
            {
              bvh->clear();
              prims.clear();
              return;
            }

            /* call BVH builder */
            NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeaf<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

#if PROFILE
          });
#endif

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }